

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLiSample> * __thiscall
pbrt::PortalImageInfiniteLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,PortalImageInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Bounds2<float> *b_00;
  float fVar6;
  Point2f uv;
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar12;
  undefined1 auVar13 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined8 uVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  Point3f PVar17;
  Vector3f VVar18;
  SampledSpectrum SVar19;
  Float duv_dw;
  Float mapPDF;
  float local_80;
  undefined1 local_78 [16];
  Point2f u_local;
  optional<pbrt::Bounds2<float>_> b;
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  u_local.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar8._0_16_);
  PVar17 = LightSampleContext::p(&ctx);
  local_80 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = in_register_00001208;
  _mapPDF = vmovlps_avx(auVar9._0_16_);
  ImageBounds(&b,this,(Point3f *)&mapPDF);
  if (b.set != false) {
    b_00 = pstd::optional<pbrt::Bounds2<float>_>::value(&b);
    uv = WindowedPiecewiseConstant2D::Sample(&this->distribution,&u_local,b_00,&mapPDF);
    if ((mapPDF != 0.0) || (NAN(mapPDF))) {
      local_78._8_8_ = extraout_XMM0_Qb;
      local_78._0_4_ = uv.super_Tuple2<pbrt::Point2,_float>.x;
      local_78._4_4_ = uv.super_Tuple2<pbrt::Point2,_float>.y;
      uVar12 = extraout_XMM0_Qb;
      VVar18 = RenderFromImage(this,uv,&duv_dw);
      if ((duv_dw != 0.0) || (NAN(duv_dw))) {
        uVar15 = 0;
        fVar6 = mapPDF / duv_dw;
        if (ABS(fVar6) == INFINITY) {
          LogFatal<char_const(&)[12]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
                     ,0x482,"Check failed: %s",(char (*) [12])"!IsInf(pdf)");
        }
        auVar13 = ZEXT856((ulong)local_78._8_8_);
        SVar19 = ImageLookup(this,(Point2f)local_78._0_8_,&lambda);
        auVar10._0_8_ = SVar19.values.values._0_8_;
        auVar10._8_56_ = auVar13;
        local_78 = auVar10._0_16_;
        PVar17 = LightSampleContext::p(&ctx);
        auVar11._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar11._8_56_ = auVar13;
        fVar1 = this->sceneRadius;
        auVar5._8_8_ = uVar12;
        auVar5._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
        fVar1 = fVar1 + fVar1;
        auVar7 = vmovshdup_avx(auVar5);
        fVar2 = PVar17.super_Tuple3<pbrt::Point3,_float>.x +
                VVar18.super_Tuple3<pbrt::Vector3,_float>.x * fVar1;
        auVar4 = vmovshdup_avx(auVar11._0_16_);
        fVar3 = PVar17.super_Tuple3<pbrt::Point3,_float>.z +
                VVar18.super_Tuple3<pbrt::Vector3,_float>.z * fVar1;
        fVar1 = auVar4._0_4_ + auVar7._0_4_ * fVar1;
        auVar16._4_4_ = fVar2;
        auVar16._0_4_ = fVar2;
        auVar16._8_4_ = fVar2;
        auVar16._12_4_ = fVar2;
        auVar14._4_4_ = fVar3;
        auVar14._0_4_ = fVar3;
        auVar14._8_4_ = fVar3;
        auVar14._12_4_ = fVar3;
        auVar7._4_4_ = fVar1;
        auVar7._0_4_ = fVar1;
        auVar7._8_4_ = fVar1;
        auVar7._12_4_ = fVar1;
        auVar7 = vmovlhps_avx(auVar16,auVar7);
        *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) =
             ZEXT432(0) << 0x20;
        __return_storage_ptr__->set = true;
        auVar4._8_8_ = uVar15;
        auVar4._0_8_ = SVar19.values.values._8_8_;
        auVar4 = vunpcklpd_avx(local_78,auVar4);
        *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar4;
        uVar12 = vmovlps_avx(auVar5);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar12;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
             VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar6;
        *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar7;
        uVar12 = vmovlps_avx(auVar14);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar12;
        *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
             &(this->super_LightBase).mediumInterface;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
        goto LAB_002fd63d;
      }
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
LAB_002fd63d:
  pstd::optional<pbrt::Bounds2<float>_>::~optional(&b);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> PortalImageInfiniteLight::SampleLi(
    LightSampleContext ctx, Point2f u, SampledWavelengths lambda,
    LightSamplingMode mode) const {
    // Sample $(u,v)$ in potentially-visible region of light image
    pstd::optional<Bounds2f> b = ImageBounds(ctx.p());
    if (!b)
        return {};
    Float mapPDF;
    Point2f uv = distribution.Sample(u, *b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert portal image sample point to direction and compute PDF
    Float duv_dw;
    Vector3f wi = RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};
    Float pdf = mapPDF / duv_dw;
    CHECK(!IsInf(pdf));

    // Compute radiance for portal light sample and return _LightLiSample_
    SampledSpectrum L = ImageLookup(uv, lambda);
    Point3f pl = ctx.p() + 2 * sceneRadius * wi;
    return LightLiSample(L, wi, pdf, Interaction(pl, &mediumInterface));
}